

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::AddNgon(ImDrawList *this,ImVec2 *center,float radius,ImU32 col,int num_segments,
                   float thickness)

{
  float a_max;
  float thickness_local;
  int num_segments_local;
  ImU32 col_local;
  float radius_local;
  ImVec2 *center_local;
  ImDrawList *this_local;
  
  if (((col & 0xff000000) != 0) && (2 < num_segments)) {
    PathArcTo(this,center,radius - 0.5,0.0,
              (((float)num_segments - 1.0) * 6.2831855) / (float)num_segments,num_segments + -1);
    PathStroke(this,col,1,thickness);
  }
  return;
}

Assistant:

void ImDrawList::AddNgon(const ImVec2& center, float radius, ImU32 col, int num_segments, float thickness)
{
    if ((col & IM_COL32_A_MASK) == 0 || num_segments <= 2)
        return;

    // Because we are filling a closed shape we remove 1 from the count of segments/points
    const float a_max = (IM_PI * 2.0f) * ((float)num_segments - 1.0f) / (float)num_segments;
    PathArcTo(center, radius - 0.5f, 0.0f, a_max, num_segments - 1);
    PathStroke(col, ImDrawFlags_Closed, thickness);
}